

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::shiftPvec(SPxSolverBase<double> *this)

{
  Random *this_00;
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Real RVar9;
  DataKey local_30;
  
  dVar5 = leavetol(this);
  dVar5 = dVar5 * 10.0;
  dVar6 = leavetol(this);
  dVar6 = dVar6 * 100.0;
  dVar7 = leavetol(this);
  dVar8 = epsilon(this);
  dVar7 = dVar7 - dVar8;
  uVar4 = (this->thecovectors->set).thenum;
  this_00 = &this->random;
  while (0 < (int)uVar4) {
    uVar4 = uVar4 - 1;
    local_30 = (DataKey)coId(this,uVar4);
    bVar3 = isBasic(this,(SPxId *)&local_30);
    dVar8 = (this->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    dVar1 = (this->theCoPvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar4];
    dVar2 = (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    if ((bVar3) || (dVar1 < dVar7 + dVar8)) {
      if ((~bVar3 & dVar1 <= dVar2 - dVar7) != 0) {
        if ((dVar8 != dVar2) || (NAN(dVar8) || NAN(dVar2))) {
          RVar9 = Random::next(this_00,dVar5,dVar6);
          shiftLCbound(this,uVar4,dVar1 - RVar9);
        }
        else {
          shiftLCbound(this,uVar4,dVar1);
          (this->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] =
               (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
        }
      }
    }
    else if ((dVar8 != dVar2) || (NAN(dVar8) || NAN(dVar2))) {
      RVar9 = Random::next(this_00,dVar5,dVar6);
      shiftUCbound(this,uVar4,RVar9 + dVar1);
    }
    else {
      shiftUCbound(this,uVar4,dVar1);
      (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] =
           (this->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4];
    }
  }
  uVar4 = (this->thevectors->set).thenum;
  while (0 < (int)uVar4) {
    uVar4 = uVar4 - 1;
    local_30 = (DataKey)id(this,uVar4);
    bVar3 = isBasic(this,(SPxId *)&local_30);
    dVar8 = (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    dVar1 = (this->thePvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar4];
    dVar2 = (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    if ((bVar3) || (dVar1 < dVar7 + dVar8)) {
      if ((~bVar3 & dVar1 <= dVar2 - dVar7) != 0) {
        if ((dVar8 != dVar2) || (NAN(dVar8) || NAN(dVar2))) {
          RVar9 = Random::next(this_00,dVar5,dVar6);
          shiftLPbound(this,uVar4,dVar1 - RVar9);
        }
        else {
          shiftLPbound(this,uVar4,dVar1);
          (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] =
               (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
        }
      }
    }
    else if ((dVar8 != dVar2) || (NAN(dVar8) || NAN(dVar2))) {
      RVar9 = Random::next(this_00,dVar5,dVar6);
      shiftUPbound(this,uVar4,RVar9 + dVar1);
    }
    else {
      shiftUPbound(this,uVar4,dVar1);
      (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] =
           (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4];
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftPvec()
{

   /* the allowed tolerance is (rep() == ROW) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because thePvec is the primal VectorBase<R> in ROW and the
    * dual VectorBase<R> in COLUMN representation; this is equivalent to leavetol()
    */
   R minrandom = 10.0 * leavetol();
   R maxrandom = 100.0 * leavetol();
   R allow = leavetol() - epsilon();
   bool tmp;
   int i;

   assert(type() == LEAVE);
   assert(allow > 0.0);

   for(i = dim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(coId(i));

      if((*theCoUbound)[i] + allow <= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftUCbound(i, (*theCoPvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUCbound(i, (*theCoPvec)[i]);
            (*theCoLbound)[i] = (*theCoUbound)[i];
         }
      }
      else if((*theCoLbound)[i] - allow >= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftLCbound(i, (*theCoPvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLCbound(i, (*theCoPvec)[i]);
            (*theCoUbound)[i] = (*theCoLbound)[i];
         }
      }
   }

   for(i = coDim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(id(i));

      if((*theUbound)[i] + allow <= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftUPbound(i, (*thePvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUPbound(i, (*thePvec)[i]);
            (*theLbound)[i] = (*theUbound)[i];
         }
      }
      else if((*theLbound)[i] - allow >= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftLPbound(i, (*thePvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLPbound(i, (*thePvec)[i]);
            (*theUbound)[i] = (*theLbound)[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT02 shiftPvec: OK\n");
#endif
}